

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adsc.c
# Opt level: O0

void la_adsc_intermediate_projection_format_text
               (la_adsc_formatter_ctx_t *ctx,char *label,void *data)

{
  undefined8 *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  char *pcVar1;
  la_adsc_intermediate_projection_t *p;
  
  la_vstring_append_sprintf((la_vstring *)*in_RDI,"%*s%s:\n",(ulong)*(uint *)(in_RDI + 1),"",in_RSI)
  ;
  *(int *)(in_RDI + 1) = *(int *)(in_RDI + 1) + 1;
  la_vstring_append_sprintf
            ((la_vstring *)*in_RDX,(char *)*in_RDI,"%*sDistance: %.3f nm\n",
             (ulong)*(uint *)(in_RDI + 1),"");
  pcVar1 = "";
  if (*(char *)(in_RDX + 3) != '\0') {
    pcVar1 = " (invalid)";
  }
  la_vstring_append_sprintf
            ((la_vstring *)in_RDX[1],(char *)*in_RDI,"%*sTrue track: %.1f deg%s\n",
             (ulong)*(uint *)(in_RDI + 1),"",pcVar1);
  la_vstring_append_sprintf
            ((la_vstring *)*in_RDI,"%*sAlt: %d ft\n",(ulong)*(uint *)(in_RDI + 1),"",
             (ulong)*(uint *)(in_RDX + 2));
  la_vstring_append_sprintf
            ((la_vstring *)*in_RDI,"%*sETA: %d sec\n",(ulong)*(uint *)(in_RDI + 1),"",
             (ulong)*(uint *)((long)in_RDX + 0x14));
  *(int *)(in_RDI + 1) = *(int *)(in_RDI + 1) + -1;
  return;
}

Assistant:

LA_ADSC_FORMATTER_FUN(la_adsc_intermediate_projection_format_text) {
	la_adsc_intermediate_projection_t const *p = data;
	LA_ISPRINTF(ctx->vstr, ctx->indent, "%s:\n", label);
	ctx->indent++;
	LA_ISPRINTF(ctx->vstr, ctx->indent, "Distance: %.3f nm\n", p->distance);
	LA_ISPRINTF(ctx->vstr, ctx->indent, "True track: %.1f deg%s\n", p->track, p->track_invalid ? " (invalid)" : "");
	LA_ISPRINTF(ctx->vstr, ctx->indent, "Alt: %d ft\n", p->alt);
	LA_ISPRINTF(ctx->vstr, ctx->indent, "ETA: %d sec\n", p->eta);
	ctx->indent--;
}